

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::RunCMakeAndTest(cmCTest *this,string *output)

{
  int iVar1;
  cmCTestBuildAndTestHandler *this_00;
  char *pcVar2;
  ostream *this_01;
  void *this_02;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  int retv;
  cmCTestBuildAndTestHandler *handler;
  string *output_local;
  cmCTest *this_local;
  
  this->Verbose = true;
  this_00 = (cmCTestBuildAndTestHandler *)GetHandler(this,"buildtest");
  iVar1 = (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
  pcVar2 = cmCTestBuildAndTestHandler::GetOutput(this_00);
  std::__cxx11::string::operator=((string *)output,pcVar2);
  cmDynamicLoader::FlushCache();
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    this_01 = std::operator<<((ostream *)local_1a0,"build and test failing returning: ");
    this_02 = (void *)std::ostream::operator<<(this_01,iVar1);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x8d4,pcVar2,false);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return iVar1;
}

Assistant:

int cmCTest::RunCMakeAndTest(std::string* output)
{
  this->Verbose = true;
  cmCTestBuildAndTestHandler* handler =
    static_cast<cmCTestBuildAndTestHandler*>(this->GetHandler("buildtest"));
  int retv = handler->ProcessHandler();
  *output = handler->GetOutput();
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  if (retv != 0) {
    cmCTestLog(this, DEBUG, "build and test failing returning: " << retv
                                                                 << std::endl);
  }
  return retv;
}